

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_ion.c
# Opt level: O2

int ion_map_fd(int fd,ion_user_handle_t handle,int *map_fd)

{
  int iVar1;
  ion_fd_data data;
  
  data.fd = 0;
  data.handle = handle;
  if (map_fd != (int *)0x0) {
    iVar1 = ion_ioctl(fd,-0x3ff7b6fe,&data);
    if (iVar1 < 0) {
      return iVar1;
    }
    *map_fd = data.fd;
    if (-1 < (long)data) {
      return 0;
    }
    _mpp_log_l(2,"mpp_ion","map ioctl returned negative fd\n",(char *)0x0);
  }
  return -0x16;
}

Assistant:

static int ion_map_fd(int fd, ion_user_handle_t handle, int *map_fd)
{
    int ret;
    struct ion_fd_data data = {
        .handle = handle,
    };

    if (map_fd == NULL)
        return -EINVAL;

    ret = ion_ioctl(fd, ION_IOC_MAP, &data);
    if (ret < 0)
        return ret;

    *map_fd = data.fd;
    if (*map_fd < 0) {
        mpp_err("map ioctl returned negative fd\n");
        return -EINVAL;
    }

    return 0;
}